

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64_stage11_sse4_1
               (__m128i *u,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i in0;
  __m128i in1;
  longlong in_stack_00000008;
  int i_1;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  int i;
  __m128i *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar1;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  int local_80;
  int local_7c;
  __m128i *local_78;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_6c = (int)in_R8;
  local_78 = in_R9;
  local_68 = in_ECX;
  local_64 = in_EDX;
  local_60 = in_RSI;
  for (local_7c = 0; local_7c < 0x20; local_7c = local_7c + 1) {
    in0[0] = local_60 + (long)local_7c * 0x10;
    in0[1] = local_60 + 0x3f0 + (long)local_7c * -0x10;
    in1[1] = in_stack_00000008;
    in1[0] = (longlong)local_78;
    addsub_sse4_1(in0,in1,in_R8,in_R9,in_stack_ffffffffffffff48,
                  (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  if (local_64 == 0) {
    if (local_68 + 6 < 0x10) {
      local_80 = 0x10;
    }
    else {
      local_80 = local_68 + 6;
    }
    local_4c = -(1 << ((char)local_80 - 1U & 0x1f));
    local_98 = CONCAT44(local_4c,local_4c);
    lStack_90 = CONCAT44(local_4c,local_4c);
    local_50 = (1 << ((char)local_80 - 1U & 0x1f)) + -1;
    local_a8 = CONCAT44(local_50,local_50);
    lStack_a0 = CONCAT44(local_50,local_50);
    local_48 = local_98;
    lStack_40 = lStack_90;
    local_38 = local_4c;
    local_34 = local_4c;
    local_30 = local_4c;
    local_2c = local_4c;
    local_28 = local_a8;
    lStack_20 = lStack_a0;
    local_10 = local_50;
    local_c = local_50;
    local_8 = local_50;
    local_4 = local_50;
    for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 4) {
      round_shift_4x4((__m128i *)(local_60 + (long)iVar1 * 0x10),local_6c);
      highbd_clamp_epi32_sse4_1
                ((__m128i *)(local_60 + (long)iVar1 * 0x10),
                 (__m128i *)(local_60 + (long)iVar1 * 0x10),(__m128i *)&local_98,
                 (__m128i *)&local_a8,4);
    }
  }
  return;
}

Assistant:

static inline void idct64_stage11_sse4_1(__m128i *u, __m128i *out, int do_cols,
                                         int bd, int out_shift,
                                         const __m128i *clamp_lo,
                                         const __m128i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_sse4_1(u[i], u[63 - i], out + i, out + 63 - i, clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    for (int i = 0; i < 64; i += 4) {
      round_shift_4x4(out + i, out_shift);
      highbd_clamp_epi32_sse4_1(out + i, out + i, &clamp_lo_out, &clamp_hi_out,
                                4);
    }
  }
}